

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O2

void __thiscall QIODevicePrivate::~QIODevicePrivate(QIODevicePrivate *this)

{
  this->_vptr_QIODevicePrivate = (_func_int **)&PTR__QIODevicePrivate_001886d0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->errorString).d);
  QVarLengthArray<QRingBuffer,_1LL>::~QVarLengthArray(&this->writeBuffers);
  QVarLengthArray<QRingBuffer,_2LL>::~QVarLengthArray(&this->readBuffers);
  return;
}

Assistant:

QIODevicePrivate::~QIODevicePrivate()
{
}